

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_sasl_outcome(AMQP_VALUE value,SASL_OUTCOME_HANDLE *sasl_outcome_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  undefined1 local_58 [8];
  amqp_binary additional_data;
  sasl_code code;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  SASL_OUTCOME_HANDLE *ppSStack_18;
  int result;
  SASL_OUTCOME_HANDLE *sasl_outcome_handle_local;
  AMQP_VALUE value_local;
  
  ppSStack_18 = sasl_outcome_handle;
  sasl_outcome_handle_local = (SASL_OUTCOME_HANDLE *)value;
  list_value = (AMQP_VALUE)sasl_outcome_create_internal();
  *ppSStack_18 = (SASL_OUTCOME_HANDLE)list_value;
  if (*ppSStack_18 == (SASL_OUTCOME_HANDLE)0x0) {
    sasl_outcome_instance._4_4_ = 0x2d7d;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)sasl_outcome_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      sasl_outcome_destroy(*ppSStack_18);
      sasl_outcome_instance._4_4_ = 0x2d85;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          sasl_outcome_instance._4_4_ = 0x2db9;
        }
        else {
          pAVar3 = amqpvalue_get_list_item(pAStack_30,0);
          if (pAVar3 == (AMQP_VALUE)0x0) {
            sasl_outcome_destroy(*ppSStack_18);
            sasl_outcome_instance._4_4_ = 0x2d9b;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar3);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar3);
              sasl_outcome_destroy(*ppSStack_18);
              sasl_outcome_instance._4_4_ = 0x2da5;
            }
            else {
              iVar1 = amqpvalue_get_ubyte(pAVar3,&additional_data.field_0xf);
              if (iVar1 == 0) {
                amqpvalue_destroy(pAVar3);
                if ((1 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,1), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_binary(pAVar3,(amqp_binary *)local_58), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    sasl_outcome_destroy(*ppSStack_18);
                    return 0x2dd1;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)sasl_outcome_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                sasl_outcome_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy(pAVar3);
                sasl_outcome_destroy(*ppSStack_18);
                sasl_outcome_instance._4_4_ = 0x2daf;
              }
            }
          }
        }
      }
      else {
        sasl_outcome_instance._4_4_ = 0x2d8c;
      }
    }
  }
  return sasl_outcome_instance._4_4_;
}

Assistant:

int amqpvalue_get_sasl_outcome(AMQP_VALUE value, SASL_OUTCOME_HANDLE* sasl_outcome_handle)
{
    int result;
    SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome_create_internal();
    *sasl_outcome_handle = sasl_outcome_instance;
    if (*sasl_outcome_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_outcome_destroy(*sasl_outcome_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* code */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_outcome_destroy(*sasl_outcome_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_outcome_destroy(*sasl_outcome_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                sasl_code code;
                                if (amqpvalue_get_sasl_code(item_value, &code) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_outcome_destroy(*sasl_outcome_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* additional-data */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary additional_data;
                                if (amqpvalue_get_binary(item_value, &additional_data) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_outcome_destroy(*sasl_outcome_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    sasl_outcome_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}